

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O3

int scanForQuads(StructureConfig sconf,int radius,uint64_t s48,uint64_t *lowBits,int lowBitN,
                uint64_t salt,int x,int z,int w,int h,Pos *qplist,int n)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int extraout_EDX;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  uint64_t uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  uint uVar35;
  uint uVar39;
  uint uVar40;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar41;
  undefined1 auVar38 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  uint uVar47;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar48 [16];
  uint uVar52;
  uint uVar54;
  uint uVar55;
  undefined1 auVar53 [16];
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int local_108;
  int local_100;
  int local_f8;
  ulong local_f0;
  int R;
  long local_c0;
  long local_a8;
  uint8_t local_80;
  
  if (lowBitN == 0x14) {
    local_c0 = 0x2057d;
  }
  else if (lowBitN == 0x30) {
    local_c0 = 0xc0654be2057d;
  }
  else {
    uVar8 = 1L << ((byte)lowBitN & 0x3f);
    if ((long)uVar8 < 2) {
      local_c0 = 0;
    }
    else {
      local_c0 = 0;
      uVar5 = 0x1ef1565bd5;
      lVar3 = 1;
      uVar27 = uVar8;
      lVar22 = 0;
      do {
        lVar23 = lVar22;
        if (uVar27 == 0) goto LAB_00129ea1;
        uVar4 = uVar5 % uVar27;
        lVar22 = lVar3 - (uVar5 / uVar27) * lVar23;
        bVar32 = 1 < (long)uVar27;
        uVar5 = uVar27;
        lVar3 = lVar23;
        uVar27 = uVar4;
      } while (bVar32);
      local_c0 = (lVar23 >> 0x3f & uVar8) + lVar23;
    }
  }
LAB_00129ea1:
  uVar26 = *lowBits;
  if (uVar26 == 0) {
    iVar1 = 0;
  }
  else {
    lVar22 = 1L << ((byte)lowBitN & 0x3f);
    uVar8 = (ulong)z;
    lVar23 = (long)h + uVar8;
    lVar3 = (long)sconf.salt;
    iVar16 = sconf._1_4_ >> 0x18;
    iVar24 = sconf._2_4_ >> 0x18;
    iVar1 = radius + 7;
    if (-1 < radius) {
      iVar1 = radius;
    }
    uVar6 = (iVar1 >> 3) * (iVar1 >> 3);
    iVar1 = (iVar16 - iVar24) + 1;
    fVar42 = (float)(int)(uVar6 - iVar1 * iVar1);
    iVar7 = radius * -2 + 0x41;
    iVar1 = radius * -2 + 0x48;
    if (-1 < iVar7) {
      iVar1 = iVar7;
    }
    iVar7 = (iVar1 >> 3) + iVar16 * 2;
    lVar15 = lVar22 << 0x20;
    fVar46 = SQRT(fVar42);
    uVar5 = lVar22 - 1;
    lVar19 = 0;
    iVar1 = 0;
    do {
      iVar14 = 0;
      if ((iVar1 < n) && (iVar14 = 0, -1 < w)) {
        uVar27 = uVar26 - salt & uVar5;
        iVar14 = 0;
        local_a8 = (long)x;
        do {
          uVar4 = (local_a8 * -0x4f9939f508 + (uVar27 - s48)) * local_c0 & uVar5 | -lVar22 & uVar8;
          lVar13 = 0;
          if ((long)uVar4 < (long)uVar8) {
            lVar13 = lVar22;
          }
          lVar13 = lVar13 + uVar4;
          if (lVar13 <= lVar23) {
            lVar29 = lVar13 * -0x100000000;
            do {
              uVar4 = (lVar29 >> 0x20) * 0xffe10ea9a42b +
                      (local_a8 * -0x100000000 >> 0x20) * 0xffb066c60af8 + s48 & 0xffffffffffff;
              if ((uVar4 & uVar5) == uVar27) {
                local_80 = sconf.structType;
                switch(local_80) {
                case '\x01':
                case '\x02':
                case '\x04':
                case '\x05':
                  uVar4 = uVar4 + lVar3;
                  if (radius == 0x80) {
                    uVar9 = (uVar4 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar35 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                    iVar20 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                    if ((0x13 < iVar20) &&
                       (uVar35 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                       iVar2 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, 0x13 < iVar2)) {
                      uVar9 = (uVar4 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar35 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                      iVar10 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                      if ((iVar10 <= iVar20 + -0x14) &&
                         ((uVar35 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                          iVar12 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, iVar12 <= iVar2 + -0x14
                          && (iVar61 = (iVar10 - iVar20) + 0x20, iVar62 = (iVar12 - iVar2) + 0x20,
                             (uint)(iVar62 * iVar62 + iVar61 * iVar61) < 0x100)))) {
                        uVar9 = (uVar4 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar35 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                        iVar61 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                        if ((iVar61 < 4) &&
                           (uVar35 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                           iVar62 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, 0x13 < iVar62)) {
                          uVar4 = (uVar4 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar35 = (uint)(uVar4 >> 0x11) & 0x7fffffff;
                          iVar63 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                          if (((0x13 < iVar63) &&
                              (uVar35 = (uint)(uVar4 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                              iVar64 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, iVar64 < 4)) &&
                             (iVar17 = (iVar61 - iVar63) + 0x20, iVar21 = (iVar64 - iVar62) + 0x20,
                             (uint)(iVar21 * iVar21 + iVar17 * iVar17) < 0x100)) {
                            iVar17 = 0;
                            iVar21 = 0;
LAB_0012ace2:
                            fVar34 = getEnclosingRadius(iVar20,iVar2,iVar10,iVar12,iVar61,iVar62,
                                                        iVar63,iVar64,iVar17,iVar17,iVar21,0x20,0x80
                                                       );
                            fVar33 = 128.0;
LAB_0012b485:
                            if ((fVar34 < fVar33) && ((fVar34 != 0.0 || (NAN(fVar34))))) {
                              (qplist + iVar1)[iVar14].x = (int)local_a8;
                              (qplist + iVar1)[iVar14].z = (int)lVar13;
                              iVar14 = iVar14 + 1;
                              if (n - iVar1 <= iVar14) goto LAB_0012b50b;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    fVar33 = fVar46;
                    if (fVar42 < 0.0) {
                      fVar33 = sqrtf(fVar42);
                    }
                    iVar20 = iVar16 - (int)fVar33;
                    uVar9 = (uVar4 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar35 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) % (long)iVar24
                                   );
                    if (iVar20 < (int)uVar35) {
                      uVar31 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                   0x7fffffff) % (long)iVar24);
                      if (iVar20 < (int)uVar31) {
                        uVar9 = (uVar4 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar39 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                       (long)iVar24);
                        if ((((int)uVar39 < (int)(uVar35 - iVar20)) &&
                            (uVar40 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11)
                                                          & 0x7fffffff) % (long)iVar24),
                            (int)uVar40 < (int)(uVar31 - iVar20))) &&
                           (iVar2 = (iVar16 - uVar35) + uVar39, iVar10 = (iVar16 - uVar31) + uVar40,
                           (uint)(iVar10 * iVar10 + iVar2 * iVar2) <= uVar6)) {
                          uVar25 = (uVar4 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar9 = (long)(uVar25 >> 0x11 & 0x7fffffff) % (long)iVar24;
                          local_f0 = uVar9 & 0xffffffff;
                          if (((int)uVar9 < iVar24 - iVar20) &&
                             (uVar47 = (uint)((long)(ulong)((uint)(uVar25 * 0x5deece66d + 0xb >>
                                                                  0x11) & 0x7fffffff) % (long)iVar24
                                             ), iVar20 < (int)uVar47)) {
                            uVar4 = (uVar4 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar49 = (uint)((long)(ulong)((uint)(uVar4 >> 0x11) & 0x7fffffff) %
                                           (long)iVar24);
                            if ((iVar20 < (int)uVar49) &&
                               (uVar50 = (uint)((long)(ulong)((uint)(uVar4 * 0x5deece66d + 0xb >>
                                                                    0x11) & 0x7fffffff) %
                                               (long)iVar24), uVar50 < (uint)(iVar24 - iVar20)))
                            goto LAB_0012af59;
                          }
                        }
                      }
                    }
                  }
                  break;
                case '\x03':
                  uVar4 = uVar4 + lVar3;
                  if (radius == 0x80) {
                    uVar9 = (uVar4 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar35 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                    iVar20 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                    if ((0x13 < iVar20) &&
                       (uVar35 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                       iVar2 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, 0x13 < iVar2)) {
                      uVar9 = (uVar4 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar35 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                      iVar10 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                      if ((iVar10 <= iVar20 + -0x14) &&
                         ((uVar35 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                          iVar12 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, iVar12 <= iVar2 + -0x14
                          && (iVar61 = (iVar10 - iVar20) + 0x20, iVar62 = (iVar12 - iVar2) + 0x20,
                             (uint)(iVar62 * iVar62 + iVar61 * iVar61) < 0x100)))) {
                        uVar9 = (uVar4 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar35 = (uint)(uVar9 >> 0x11) & 0x7fffffff;
                        iVar61 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                        if ((iVar61 < 4) &&
                           (uVar35 = (uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                           iVar62 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, 0x13 < iVar62)) {
                          uVar4 = (uVar4 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar35 = (uint)(uVar4 >> 0x11) & 0x7fffffff;
                          iVar63 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3;
                          if (((0x13 < iVar63) &&
                              (uVar35 = (uint)(uVar4 * 0x5deece66d + 0xb >> 0x11) & 0x7fffffff,
                              iVar64 = uVar35 + (uVar35 / 3 & 0xfffffff8) * -3, iVar64 < 4)) &&
                             (iVar17 = (iVar61 - iVar63) + 0x20, iVar21 = (iVar64 - iVar62) + 0x20,
                             (uint)(iVar21 * iVar21 + iVar17 * iVar17) < 0x100)) {
                            iVar21 = 10;
                            iVar17 = 8;
                            goto LAB_0012ace2;
                          }
                        }
                      }
                    }
                  }
                  else {
                    fVar33 = fVar46;
                    if (fVar42 < 0.0) {
                      fVar33 = sqrtf(fVar42);
                    }
                    iVar20 = iVar16 - (int)fVar33;
                    uVar9 = (uVar4 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                    uVar35 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) % (long)iVar24
                                   );
                    if (iVar20 < (int)uVar35) {
                      uVar31 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                   0x7fffffff) % (long)iVar24);
                      if (iVar20 < (int)uVar31) {
                        uVar9 = (uVar4 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar39 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                       (long)iVar24);
                        if ((((int)uVar39 < (int)(uVar35 - iVar20)) &&
                            (uVar40 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11)
                                                          & 0x7fffffff) % (long)iVar24),
                            (int)uVar40 < (int)(uVar31 - iVar20))) &&
                           (iVar2 = (iVar16 - uVar35) + uVar39, iVar10 = (iVar16 - uVar31) + uVar40,
                           (uint)(iVar10 * iVar10 + iVar2 * iVar2) <= uVar6)) {
                          uVar25 = (uVar4 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar9 = (long)(uVar25 >> 0x11 & 0x7fffffff) % (long)iVar24;
                          local_f0 = uVar9 & 0xffffffff;
                          uVar41 = (uint)uVar9;
                          if (((int)uVar41 < iVar24 - iVar20) &&
                             (uVar47 = (uint)((long)(ulong)((uint)(uVar25 * 0x5deece66d + 0xb >>
                                                                  0x11) & 0x7fffffff) % (long)iVar24
                                             ), iVar20 < (int)uVar47)) {
                            uVar4 = (uVar4 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar49 = (uint)((long)(ulong)((uint)(uVar4 >> 0x11) & 0x7fffffff) %
                                           (long)iVar24);
                            if ((iVar20 < (int)uVar49) &&
                               ((uVar50 = (uint)((long)(ulong)((uint)(uVar4 * 0x5deece66d + 0xb >>
                                                                     0x11) & 0x7fffffff) %
                                                (long)iVar24), uVar50 < (uint)(iVar24 - iVar20) &&
                                (iVar20 = (uVar41 + iVar16) - uVar49,
                                iVar2 = (iVar16 - uVar47) + uVar50,
                                (uint)(iVar2 * iVar2 + iVar20 * iVar20) <= uVar6)))) {
                              iVar10 = 10;
                              iVar2 = 8;
                              iVar20 = iVar2;
                              goto LAB_0012b476;
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                case '\x06':
                case '\a':
                case '\v':
                  fVar33 = fVar46;
                  if (fVar42 < 0.0) {
                    fVar33 = sqrtf(fVar42);
                  }
                  uVar4 = uVar4 + lVar3;
                  iVar20 = iVar16 - (int)fVar33;
                  uVar9 = (uVar4 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar35 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) % (long)iVar24);
                  if (iVar20 < (int)uVar35) {
                    uVar31 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                 0x7fffffff) % (long)iVar24);
                    if (iVar20 < (int)uVar31) {
                      uVar9 = (uVar4 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar39 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                     (long)iVar24);
                      if ((((int)uVar39 < (int)(uVar35 - iVar20)) &&
                          (uVar40 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                        0x7fffffff) % (long)iVar24),
                          (int)uVar40 < (int)(uVar31 - iVar20))) &&
                         (iVar2 = (iVar16 - uVar35) + uVar39, iVar10 = (iVar16 - uVar31) + uVar40,
                         (uint)(iVar10 * iVar10 + iVar2 * iVar2) <= uVar6)) {
                        uVar25 = (uVar4 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar9 = (long)(uVar25 >> 0x11 & 0x7fffffff) % (long)iVar24;
                        local_f0 = uVar9 & 0xffffffff;
                        if (((int)uVar9 < iVar24 - iVar20) &&
                           (uVar47 = (uint)((long)(ulong)((uint)(uVar25 * 0x5deece66d + 0xb >> 0x11)
                                                         & 0x7fffffff) % (long)iVar24),
                           iVar20 < (int)uVar47)) {
                          uVar4 = (uVar4 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar49 = (uint)((long)(ulong)((uint)(uVar4 >> 0x11) & 0x7fffffff) %
                                         (long)iVar24);
                          if ((iVar20 < (int)uVar49) &&
                             (uVar50 = (uint)((long)(ulong)((uint)(uVar4 * 0x5deece66d + 0xb >> 0x11
                                                                  ) & 0x7fffffff) % (long)iVar24),
                             uVar50 < (uint)(iVar24 - iVar20))) {
LAB_0012af59:
                            uVar41 = (uint)local_f0;
                            iVar20 = (uVar41 + iVar16) - uVar49;
                            iVar2 = (iVar16 - uVar47) + uVar50;
                            if ((uint)(iVar2 * iVar2 + iVar20 * iVar20) <= uVar6) {
                              iVar2 = 0;
                              iVar10 = 0;
                              iVar20 = iVar2;
                              goto LAB_0012b476;
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                case '\b':
                  uVar4 = uVar4 + lVar3;
                  uVar9 = (uVar4 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar25 = uVar9 * 0x5deece66d + 0xb;
                  uVar35 = (int)((long)(ulong)((uint)(uVar25 >> 0x11) & 0x7fffffff) % (long)iVar24)
                           + (int)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) % (long)iVar24)
                  ;
                  if (iVar7 < (int)uVar35) {
                    uVar9 = uVar25 * 0x5deece66d + 0xb;
                    uVar31 = (int)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                0x7fffffff) % (long)iVar24) +
                             (int)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) % (long)iVar24)
                    ;
                    if (iVar7 < (int)uVar31) {
                      uVar9 = (uVar4 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar25 = uVar9 * 0x5deece66d + 0xb;
                      uVar39 = (int)((long)(ulong)((uint)(uVar25 >> 0x11) & 0x7fffffff) %
                                    (long)iVar24) +
                               (int)((long)(uVar9 >> 0x11 & 0x7fffffff) % (long)iVar24);
                      if ((((int)uVar39 <= (int)(uVar35 - iVar7)) &&
                          (uVar9 = uVar25 * 0x5deece66d + 0xb,
                          uVar40 = (int)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                      0x7fffffff) % (long)iVar24) +
                                   (int)((long)(uVar9 >> 0x11 & 0x7fffffff) % (long)iVar24),
                          (int)uVar40 <= (int)(uVar31 - iVar7))) &&
                         (iVar20 = (int)(uVar39 - uVar35) >> 1, iVar2 = (int)(uVar40 - uVar31) >> 1,
                         (ulong)(uint)(iVar2 * iVar2 + iVar20 * iVar20) <=
                         (ulong)((long)radius * (long)radius * 4))) {
                        uVar25 = (uVar4 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar9 = (long)(uVar25 >> 0x11 & 0x7fffffff) % (long)iVar24;
                        local_f0 = uVar9 & 0xffffffff;
                        uVar25 = uVar25 * 0x5deece66d + 0xb;
                        uVar41 = (int)((long)(uVar25 >> 0x11 & 0x7fffffff) % (long)iVar24) +
                                 (int)uVar9;
                        if (uVar41 <= uVar35 - iVar7) {
                          uVar9 = uVar25 * 0x5deece66d + 0xb;
                          uVar47 = (int)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                      0x7fffffff) % (long)iVar24) +
                                   (int)((long)(uVar9 >> 0x11 & 0x7fffffff) % (long)iVar24);
                          local_f0 = (ulong)uVar47;
                          if (iVar7 < (int)uVar47) {
                            uVar4 = (uVar4 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                            uVar9 = uVar4 * 0x5deece66d + 0xb;
                            uVar49 = (int)((long)(uVar9 >> 0x11 & 0x7fffffff) % (long)iVar24) +
                                     (int)((long)(uVar4 >> 0x11 & 0x7fffffff) % (long)iVar24);
                            if ((iVar7 < (int)uVar49) &&
                               (uVar4 = uVar9 * 0x5deece66d + 0xb,
                               uVar50 = (int)((long)(ulong)((uint)(uVar4 * 0x5deece66d + 0xb >> 0x11
                                                                  ) & 0x7fffffff) % (long)iVar24) +
                                        (int)((long)(uVar4 >> 0x11 & 0x7fffffff) % (long)iVar24),
                               uVar50 <= uVar31 - iVar7)) {
                              uVar35 = uVar35 >> 1;
                              uVar31 = uVar31 >> 1;
                              uVar39 = uVar39 >> 1;
                              uVar40 = uVar40 >> 1;
                              uVar41 = uVar41 >> 1;
                              uVar47 = uVar47 >> 1;
                              uVar49 = uVar49 >> 1;
                              uVar50 = uVar50 >> 1;
                              iVar10 = 0x3a;
                              iVar2 = 0x3a;
                              iVar20 = 0x17;
                              goto LAB_0012b476;
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                default:
                  iVar1 = 0x188d90;
                  uVar6 = (uint)sconf._6_2_;
                  lVar3 = lVar22;
                  lVar19 = lVar23;
                  scanForQuads_cold_1();
                  local_100 = (int)lVar22;
                  local_f8 = (int)uVar27;
                  iVar14 = (int)lVar15 * 0x10;
                  iVar7 = extraout_EDX + local_f8;
                  iVar16 = (iVar1 + local_f8) * 0x10 + local_100;
                  iVar20 = (int)lVar3 + local_f8;
                  iVar2 = (int)lVar19;
                  local_100 = (local_f8 + iVar24) * 0x10 + local_100;
                  iVar1 = iVar20 * 0x10;
                  if (iVar20 * 0x10 < iVar7 * 0x10) {
                    iVar1 = iVar7 * 0x10;
                  }
                  iVar24 = local_100;
                  if (local_100 < iVar16) {
                    iVar24 = iVar16;
                  }
                  iVar10 = iVar2 * 0x10;
                  if (SBORROW4(iVar14,iVar2 * 0x10) != iVar14 + iVar2 * -0x10 < 0) {
                    iVar10 = iVar14;
                  }
                  if (iVar24 - (int)local_f0 <= iVar10 + (int)local_f0) {
                    iVar12 = iVar1 - (int)local_f0;
                    iVar14 = (int)fVar46 * 0x10;
                    if ((int)(uVar6 * 0x10) < (int)fVar46 * 0x10) {
                      iVar14 = uVar6 * 0x10;
                    }
                    local_108 = (int)lVar23;
                    uVar31 = (iVar14 + (int)local_f0 * 2) - iVar1;
                    uVar35 = 0x7fffffff;
                    iVar1 = iVar24 - (int)local_f0;
                    do {
                      if (iVar12 <= iVar14 + (int)local_f0) {
                        iVar17 = (iVar1 - local_100) * (iVar1 - local_100);
                        iVar21 = iVar1 + iVar2 * -0x10;
                        iVar21 = iVar21 * iVar21;
                        iVar28 = (iVar1 - iVar16) * (iVar1 - iVar16);
                        iVar30 = iVar1 + (int)lVar15 * -0x10;
                        iVar30 = iVar30 * iVar30;
                        iVar24 = 4;
                        uVar39 = uVar35;
                        uVar40 = uVar35;
                        uVar41 = uVar35;
                        iVar61 = iVar12;
                        iVar62 = iVar12 + 1;
                        iVar63 = iVar12 + 2;
                        iVar64 = iVar12 + 3;
                        do {
                          uVar60 = uVar41;
                          uVar59 = uVar40;
                          uVar58 = uVar39;
                          uVar57 = uVar35;
                          auVar53._0_4_ = iVar61 + uVar6 * -0x10;
                          auVar53._4_4_ = iVar62 + uVar6 * -0x10;
                          auVar53._8_4_ = iVar63 + uVar6 * -0x10;
                          auVar53._12_4_ = iVar64 + uVar6 * -0x10;
                          auVar36._4_4_ = auVar53._4_4_;
                          auVar36._0_4_ = auVar53._4_4_;
                          auVar36._8_4_ = auVar53._12_4_;
                          auVar36._12_4_ = auVar53._12_4_;
                          uVar52 = auVar53._0_4_ * auVar53._0_4_ + iVar30;
                          uVar54 = auVar53._4_4_ * auVar53._4_4_ + iVar30;
                          uVar55 = (int)((auVar53._8_8_ & 0xffffffff) * (auVar53._8_8_ & 0xffffffff)
                                        ) + iVar30;
                          uVar56 = (int)((auVar36._8_8_ & 0xffffffff) * (auVar36._8_8_ & 0xffffffff)
                                        ) + iVar30;
                          auVar37._0_4_ = iVar61 + iVar7 * -0x10;
                          auVar37._4_4_ = iVar62 + iVar7 * -0x10;
                          auVar37._8_4_ = iVar63 + iVar7 * -0x10;
                          auVar37._12_4_ = iVar64 + iVar7 * -0x10;
                          auVar43._4_4_ = auVar37._4_4_;
                          auVar43._0_4_ = auVar37._4_4_;
                          auVar43._8_4_ = auVar37._12_4_;
                          auVar43._12_4_ = auVar37._12_4_;
                          uVar47 = auVar37._0_4_ * auVar37._0_4_ + iVar28;
                          uVar49 = auVar37._4_4_ * auVar37._4_4_ + iVar28;
                          uVar50 = (int)((auVar37._8_8_ & 0xffffffff) * (auVar37._8_8_ & 0xffffffff)
                                        ) + iVar28;
                          uVar51 = (int)((auVar43._8_8_ & 0xffffffff) * (auVar43._8_8_ & 0xffffffff)
                                        ) + iVar28;
                          uVar35 = -(uint)((int)(uVar52 ^ 0x80000000) < (int)(uVar47 ^ 0x80000000));
                          uVar39 = -(uint)((int)(uVar54 ^ 0x80000000) < (int)(uVar49 ^ 0x80000000));
                          uVar40 = -(uint)((int)(uVar55 ^ 0x80000000) < (int)(uVar50 ^ 0x80000000));
                          uVar41 = -(uint)((int)(uVar56 ^ 0x80000000) < (int)(uVar51 ^ 0x80000000));
                          uVar35 = ~uVar35 & uVar52 | uVar47 & uVar35;
                          uVar39 = ~uVar39 & uVar54 | uVar49 & uVar39;
                          uVar40 = ~uVar40 & uVar55 | uVar50 & uVar40;
                          uVar41 = ~uVar41 & uVar56 | uVar51 & uVar41;
                          auVar44._0_4_ = iVar61 + iVar20 * -0x10;
                          auVar44._4_4_ = iVar62 + iVar20 * -0x10;
                          auVar44._8_4_ = iVar63 + iVar20 * -0x10;
                          auVar44._12_4_ = iVar64 + iVar20 * -0x10;
                          auVar48._4_4_ = auVar44._4_4_;
                          auVar48._0_4_ = auVar44._4_4_;
                          auVar48._8_4_ = auVar44._12_4_;
                          auVar48._12_4_ = auVar44._12_4_;
                          uVar47 = auVar44._0_4_ * auVar44._0_4_ + iVar21;
                          uVar49 = auVar44._4_4_ * auVar44._4_4_ + iVar21;
                          uVar50 = (int)((auVar44._8_8_ & 0xffffffff) * (auVar44._8_8_ & 0xffffffff)
                                        ) + iVar21;
                          uVar51 = (int)((auVar48._8_8_ & 0xffffffff) * (auVar48._8_8_ & 0xffffffff)
                                        ) + iVar21;
                          uVar52 = -(uint)((int)(uVar35 ^ 0x80000000) < (int)(uVar47 ^ 0x80000000));
                          uVar54 = -(uint)((int)(uVar39 ^ 0x80000000) < (int)(uVar49 ^ 0x80000000));
                          uVar55 = -(uint)((int)(uVar40 ^ 0x80000000) < (int)(uVar50 ^ 0x80000000));
                          uVar56 = -(uint)((int)(uVar41 ^ 0x80000000) < (int)(uVar51 ^ 0x80000000));
                          uVar52 = ~uVar52 & uVar35 | uVar47 & uVar52;
                          uVar54 = ~uVar54 & uVar39 | uVar49 & uVar54;
                          uVar55 = ~uVar55 & uVar40 | uVar50 & uVar55;
                          uVar56 = ~uVar56 & uVar41 | uVar51 & uVar56;
                          auVar38._0_4_ = iVar61 + (int)fVar46 * -0x10;
                          auVar38._4_4_ = iVar62 + (int)fVar46 * -0x10;
                          auVar38._8_4_ = iVar63 + (int)fVar46 * -0x10;
                          auVar38._12_4_ = iVar64 + (int)fVar46 * -0x10;
                          auVar45._4_4_ = auVar38._4_4_;
                          auVar45._0_4_ = auVar38._4_4_;
                          auVar45._8_4_ = auVar38._12_4_;
                          auVar45._12_4_ = auVar38._12_4_;
                          uVar35 = auVar38._0_4_ * auVar38._0_4_ + iVar17;
                          uVar39 = auVar38._4_4_ * auVar38._4_4_ + iVar17;
                          uVar40 = (int)((auVar38._8_8_ & 0xffffffff) * (auVar38._8_8_ & 0xffffffff)
                                        ) + iVar17;
                          uVar41 = (int)((auVar45._8_8_ & 0xffffffff) * (auVar45._8_8_ & 0xffffffff)
                                        ) + iVar17;
                          uVar47 = -(uint)((int)(uVar52 ^ 0x80000000) < (int)(uVar35 ^ 0x80000000));
                          uVar49 = -(uint)((int)(uVar54 ^ 0x80000000) < (int)(uVar39 ^ 0x80000000));
                          uVar50 = -(uint)((int)(uVar55 ^ 0x80000000) < (int)(uVar40 ^ 0x80000000));
                          uVar51 = -(uint)((int)(uVar56 ^ 0x80000000) < (int)(uVar41 ^ 0x80000000));
                          uVar35 = ~uVar47 & uVar52 | uVar35 & uVar47;
                          uVar39 = ~uVar49 & uVar54 | uVar39 & uVar49;
                          uVar40 = ~uVar50 & uVar55 | uVar40 & uVar50;
                          uVar41 = ~uVar51 & uVar56 | uVar41 & uVar51;
                          uVar47 = -(uint)((int)uVar35 < (int)uVar57);
                          uVar49 = -(uint)((int)uVar39 < (int)uVar58);
                          uVar50 = -(uint)((int)uVar40 < (int)uVar59);
                          uVar51 = -(uint)((int)uVar41 < (int)uVar60);
                          uVar35 = ~uVar47 & uVar57 | uVar35 & uVar47;
                          uVar39 = ~uVar49 & uVar58 | uVar39 & uVar49;
                          uVar40 = ~uVar50 & uVar59 | uVar40 & uVar50;
                          uVar41 = ~uVar51 & uVar60 | uVar41 & uVar51;
                          iVar61 = iVar61 + 4;
                          iVar62 = iVar62 + 4;
                          iVar63 = iVar63 + 4;
                          iVar64 = iVar64 + 4;
                          iVar11 = iVar24 + -4;
                          iVar18 = iVar24 + (uVar31 + 4 & 0xfffffffc);
                          iVar24 = iVar11;
                        } while (iVar18 != 8);
                        uVar47 = -iVar11;
                        uVar49 = -(uint)((int)(uVar31 ^ 0x80000000) < (int)(uVar47 ^ 0x80000000));
                        uVar50 = -(uint)((int)(uVar31 ^ 0x80000000) <
                                        (int)((uVar47 | 1) ^ 0x80000000));
                        uVar51 = -(uint)((int)(uVar31 ^ 0x80000000) <
                                        (int)((uVar47 | 2) ^ 0x80000000));
                        uVar47 = -(uint)((int)(uVar31 ^ 0x80000000) <
                                        (int)((uVar47 | 3) ^ 0x80000000));
                        uVar35 = ~uVar49 & uVar35 | uVar57 & uVar49;
                        uVar39 = ~uVar50 & uVar39 | uVar58 & uVar50;
                        uVar40 = ~uVar51 & uVar40 | uVar59 & uVar51;
                        uVar41 = ~uVar47 & uVar41 | uVar60 & uVar47;
                        uVar47 = -(uint)((int)uVar35 < (int)uVar40);
                        uVar49 = -(uint)((int)uVar39 < (int)uVar41);
                        uVar40 = ~uVar47 & uVar40 | uVar35 & uVar47;
                        uVar39 = ~uVar49 & uVar41 | uVar39 & uVar49;
                        uVar35 = -(uint)((int)uVar40 < (int)uVar39);
                        uVar35 = ~uVar35 & uVar39 | uVar40 & uVar35;
                      }
                      bVar32 = iVar1 != iVar10 + (int)local_f0;
                      iVar1 = iVar1 + 1;
                    } while (bVar32);
                    if ((uVar35 != 0x7fffffff) &&
                       (fVar42 = (float)(local_108 * local_108) * 0.25 + (float)(int)uVar35,
                       fVar42 < 0.0)) {
                      sqrtf(fVar42);
                      return extraout_EAX;
                    }
                  }
                  return local_100;
                case '\n':
                  fVar33 = fVar46;
                  if (fVar42 < 0.0) {
                    fVar33 = sqrtf(fVar42);
                  }
                  uVar4 = uVar4 + lVar3;
                  iVar20 = iVar16 - (int)fVar33;
                  uVar9 = (uVar4 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                  uVar35 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) % (long)iVar24);
                  if (iVar20 < (int)uVar35) {
                    uVar31 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                 0x7fffffff) % (long)iVar24);
                    if (iVar20 < (int)uVar31) {
                      uVar9 = (uVar4 + 0x6e8a9050dd ^ 0x5deece66d) * 0x5deece66d + 0xb;
                      uVar39 = (uint)((long)(ulong)((uint)(uVar9 >> 0x11) & 0x7fffffff) %
                                     (long)iVar24);
                      if ((((int)uVar39 < (int)(uVar35 - iVar20)) &&
                          (uVar40 = (uint)((long)(ulong)((uint)(uVar9 * 0x5deece66d + 0xb >> 0x11) &
                                                        0x7fffffff) % (long)iVar24),
                          (int)uVar40 < (int)(uVar31 - iVar20))) &&
                         (iVar2 = (iVar16 - uVar35) + uVar39, iVar10 = (iVar16 - uVar31) + uVar40,
                         (uint)(iVar10 * iVar10 + iVar2 * iVar2) <= uVar6)) {
                        uVar25 = (uVar4 + 0x4f9939f508 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                        uVar9 = (long)(uVar25 >> 0x11 & 0x7fffffff) % (long)iVar24;
                        local_f0 = uVar9 & 0xffffffff;
                        uVar41 = (uint)uVar9;
                        if (((int)uVar41 < iVar24 - iVar20) &&
                           (uVar47 = (uint)((long)(ulong)((uint)(uVar25 * 0x5deece66d + 0xb >> 0x11)
                                                         & 0x7fffffff) % (long)iVar24),
                           iVar20 < (int)uVar47)) {
                          uVar4 = (uVar4 + 0x1ef1565bd5 ^ 0x5deece66d) * 0x5deece66d + 0xb;
                          uVar49 = (uint)((long)(ulong)((uint)(uVar4 >> 0x11) & 0x7fffffff) %
                                         (long)iVar24);
                          if ((iVar20 < (int)uVar49) &&
                             ((uVar50 = (uint)((long)(ulong)((uint)(uVar4 * 0x5deece66d + 0xb >>
                                                                   0x11) & 0x7fffffff) %
                                              (long)iVar24), uVar50 < (uint)(iVar24 - iVar20) &&
                              (iVar20 = (uVar41 + iVar16) - uVar49,
                              iVar2 = (iVar16 - uVar47) + uVar50,
                              (uint)(iVar2 * iVar2 + iVar20 * iVar20) <= uVar6)))) {
                            iVar2 = 0x48;
                            iVar10 = 0x48;
                            iVar20 = 0x36;
LAB_0012b476:
                            fVar34 = getEnclosingRadius(uVar35,uVar31,uVar39,uVar40,uVar41,uVar47,
                                                        uVar49,uVar50,iVar2,iVar20,iVar10,iVar16,
                                                        radius);
                            fVar33 = (float)radius;
                            goto LAB_0012b485;
                          }
                        }
                      }
                    }
                  }
                }
              }
              lVar13 = lVar13 + lVar22;
              lVar29 = lVar29 - lVar15;
            } while (lVar13 <= lVar23);
          }
          bVar32 = local_a8 < (long)w + (long)x;
          local_a8 = local_a8 + 1;
        } while (bVar32);
      }
LAB_0012b50b:
      iVar1 = iVar1 + iVar14;
      if (n <= iVar1) {
        return iVar1;
      }
      uVar26 = lowBits[lVar19 + 1];
      lVar19 = lVar19 + 1;
    } while (uVar26 != 0);
  }
  return iVar1;
}

Assistant:

int scanForQuads(
        const StructureConfig sconf, int radius, uint64_t s48,
        const uint64_t *lowBits, int lowBitN, uint64_t salt,
        int x, int z, int w, int h, Pos *qplist, int n)
{
    int i, cnt = 0;
    uint64_t invB;
    if (lowBitN == 20)
        invB = 132477ULL;
    else if (lowBitN == 48)
        invB = 211541297333629ULL;
    else
        invB = mulInv(132897987541ULL, (1ULL << lowBitN));

    for (i = 0; lowBits[i]; i++)
    {
        cnt += scanForQuadBits(sconf, radius, s48, lowBits[i]-salt, lowBitN, invB,
                x, z, w, h, qplist+cnt, n-cnt);
        if (cnt >= n)
            break;
    }

    return cnt;
}